

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,StringTree *rest,
          ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,ArrayPtr<const_char> *rest_6,
          ArrayPtr<const_char> *rest_7,StringTree *rest_8,StringTree *rest_9,
          ArrayPtr<const_char> *rest_10,StringTree *rest_11,ArrayPtr<const_char> *rest_12,
          ArrayPtr<const_char> *rest_13)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *rest_14;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  StringTree *rest_7_00;
  StringTree *rest_8_00;
  ArrayPtr<const_char> *rest_9_00;
  StringTree *rest_10_00;
  ArrayPtr<const_char> *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  ArrayPtr<const_char> *rest_local_1;
  StringTree *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = (long)pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  pSVar3 = fwd<kj::StringTree>(rest);
  rest_14 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::StringTree>(rest_8);
  rest_8_00 = fwd<kj::StringTree>(rest_9);
  rest_9_00 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  rest_10_00 = fwd<kj::StringTree>(rest_11);
  rest_11_00 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,pSVar3,rest_14,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
             rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,rest_10_00,rest_11_00,rest_12_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}